

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::Exception::Exception(Exception *this,Exception *other)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  RefOrVoid<const_kj::Exception::Context> orig;
  String *params;
  ArrayPtr<const_unsigned_char> content;
  Detail local_b8;
  Detail *local_98;
  Detail *detail;
  Detail *__end1;
  Detail *__begin1;
  Vector<kj::Exception::Detail> *__range1;
  Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_> local_68;
  Own<kj::Exception::Context,_std::nullptr_t> *local_58;
  Own<kj::Exception::Context,_std::nullptr_t> *c;
  Own<kj::Exception::Context,_std::nullptr_t> *_c969;
  String local_30;
  Exception *local_18;
  Exception *other_local;
  Exception *this_local;
  
  local_18 = other;
  other_local = this;
  String::String(&this->ownFile);
  this->file = local_18->file;
  this->line = local_18->line;
  this->type = local_18->type;
  heapString(&this->description,&local_18->description);
  Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_>::Maybe(&this->context);
  String::String(&this->remoteTrace);
  this->traceCount = local_18->traceCount;
  this->isFullTrace = false;
  Vector<kj::Exception::Detail>::Vector(&this->details);
  pcVar3 = this->file;
  pcVar2 = String::cStr(&local_18->ownFile);
  if (pcVar3 == pcVar2) {
    heapString(&local_30,&local_18->ownFile);
    String::operator=(&this->ownFile,&local_30);
    String::~String(&local_30);
    pcVar3 = String::cStr(&this->ownFile);
    this->file = pcVar3;
  }
  bVar1 = String::operator==(&local_18->remoteTrace,(void *)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    str<kj::String_const&>((String *)&_c969,(kj *)&local_18->remoteTrace,params);
    String::operator=(&this->remoteTrace,(String *)&_c969);
    String::~String((String *)&_c969);
  }
  memcpy(this->trace,local_18->trace,(ulong)this->traceCount << 3);
  c = _::readMaybe<kj::Exception::Context,decltype(nullptr)>(&local_18->context);
  if (c != (Own<kj::Exception::Context,_std::nullptr_t> *)0x0) {
    local_58 = c;
    orig = Own<kj::Exception::Context,_std::nullptr_t>::operator*(c);
    heap<kj::Exception::Context_const&>((kj *)&__range1,orig);
    Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_>::Maybe
              (&local_68,(Own<kj::Exception::Context,_std::nullptr_t> *)&__range1);
    Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_>::operator=(&this->context,&local_68);
    Maybe<kj::Own<kj::Exception::Context,_std::nullptr_t>_>::~Maybe(&local_68);
    Own<kj::Exception::Context,_std::nullptr_t>::~Own
              ((Own<kj::Exception::Context,_std::nullptr_t> *)&__range1);
  }
  __begin1 = (Detail *)&local_18->details;
  __end1 = Vector<kj::Exception::Detail>::begin((Vector<kj::Exception::Detail> *)__begin1);
  detail = Vector<kj::Exception::Detail>::end((Vector<kj::Exception::Detail> *)__begin1);
  for (; __end1 != detail; __end1 = __end1 + 1) {
    local_98 = __end1;
    local_b8.id = __end1->id;
    content = Array<unsigned_char>::asPtr(&__end1->value);
    heapArray<unsigned_char>(&local_b8.value,content);
    Vector<kj::Exception::Detail>::add<kj::Exception::Detail>(&this->details,&local_b8);
    Detail::~Detail(&local_b8);
  }
  return;
}

Assistant:

Exception::Exception(const Exception& other) noexcept
    : file(other.file), line(other.line), type(other.type),
      description(heapString(other.description)), traceCount(other.traceCount) {
  if (file == other.ownFile.cStr()) {
    ownFile = heapString(other.ownFile);
    file = ownFile.cStr();
  }

  if (other.remoteTrace != nullptr) {
    remoteTrace = kj::str(other.remoteTrace);
  }

  memcpy(trace, other.trace, sizeof(trace[0]) * traceCount);

  KJ_IF_SOME(c, other.context) {
    context = heap(*c);
  }

  for (auto& detail: other.details) {
    details.add(Detail {
      .id = detail.id,
      .value = kj::heapArray(detail.value.asPtr()),
    });
  }
}